

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O0

bool __thiscall
sisl::body_centered_cubic<char>::is_lattice_site
          (body_centered_cubic<char> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  int iVar2;
  int *local_60;
  int *local_48;
  int _z;
  int _y;
  int _x;
  __va_list_tag *vl_local;
  int d0_local;
  body_centered_cubic<char> *this_local;
  
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_48 = (int *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_48 = (int *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_48 + 2;
  }
  iVar2 = *local_48;
  uVar1 = vl->gp_offset;
  if (uVar1 < 0x29) {
    local_60 = (int *)((long)(int)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    local_60 = (int *)vl->overflow_arg_area;
    vl->overflow_arg_area = local_60 + 2;
  }
  if (*local_60 % 2 == 0) {
    if ((iVar2 % 2 == 1) || (d0 % 2 == 1)) {
      return false;
    }
  }
  else if ((iVar2 % 2 == 0) || (d0 % 2 == 0)) {
    return false;
  }
  return true;
}

Assistant:

virtual bool is_lattice_site(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            if((_z % 2)) {
                if((_y % 2) == 0 || (_x % 2) == 0) {
                    return false;
                }
            } else if((_y % 2) == 1 || (_x % 2) == 1) {
                return false;
            }
            return true;
        }